

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluidSimulation.cpp
# Opt level: O0

void simuFluide2D(string *name,uint64_t Nx,uint64_t Ny,double tSimu,double nu,double rho,
                 double delta,double Lx,double Ly)

{
  double *pdVar1;
  ostream *poVar2;
  double *pdVar3;
  double dx_00;
  double dy_00;
  double dVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar12 [16];
  reference_wrapper<scp::Matrix<double>_> local_1f8;
  path local_1f0;
  thread local_1c8 [2];
  reference_wrapper<scp::Matrix<double>_> local_1b8;
  path local_1b0;
  thread local_188;
  thread saveThread;
  ulong local_158;
  uint64_t iterations;
  double dt;
  double dty;
  double dtx;
  double t;
  uint64_t j;
  uint64_t n;
  uint64_t i;
  Matrix<double> W;
  double local_d8;
  undefined1 local_d0 [8];
  Matrix<double> Uy;
  undefined1 local_98 [8];
  Matrix<double> Ux;
  double kappa;
  double dy;
  double dx;
  double Ly_local;
  double Lx_local;
  double delta_local;
  double rho_local;
  double nu_local;
  double tSimu_local;
  uint64_t Ny_local;
  uint64_t Nx_local;
  string *name_local;
  undefined4 uVar10;
  undefined4 uVar11;
  
  uVar10 = (undefined4)(Nx >> 0x20);
  auVar6._8_4_ = uVar10;
  auVar6._0_8_ = Nx;
  auVar6._12_4_ = 0x45300000;
  dx_00 = Lx / ((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)Nx) - 4503599627370496.0));
  uVar11 = (undefined4)(Ny >> 0x20);
  auVar7._8_4_ = uVar11;
  auVar7._0_8_ = Ny;
  auVar7._12_4_ = 0x45300000;
  dy_00 = Ly / ((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)Ny) - 4503599627370496.0));
  Ux.super_Tensor<double>._40_8_ = nu / rho;
  Uy.super_Tensor<double>._owner = false;
  Uy.super_Tensor<double>._41_7_ = 0;
  scp::Matrix<double>::Matrix
            ((Matrix<double> *)local_98,Ny,Nx,(double *)&Uy.super_Tensor<double>._owner);
  local_d8 = 0.0;
  scp::Matrix<double>::Matrix((Matrix<double> *)local_d0,Ny,Nx,&local_d8);
  scp::Matrix<double>::Matrix((Matrix<double> *)&i,Ny,Nx);
  j = 0;
  for (n = 0; n < Ny; n = n + 1) {
    for (t = 0.0; (ulong)t < Nx; t = (double)((long)t + 1)) {
      auVar5._8_4_ = (int)((ulong)t >> 0x20);
      auVar5._0_8_ = t;
      auVar5._12_4_ = 0x45300000;
      auVar8._8_4_ = uVar10;
      auVar8._0_8_ = Nx;
      auVar8._12_4_ = 0x45300000;
      auVar9._8_4_ = (int)(n >> 0x20);
      auVar9._0_8_ = n;
      auVar9._12_4_ = 0x45300000;
      auVar12._8_4_ = uVar11;
      auVar12._0_8_ = Ny;
      auVar12._12_4_ = 0x45300000;
      dVar4 = anon_unknown.dwarf_17a80::wInit
                        (((auVar5._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,SUB84(t,0)) - 4503599627370496.0) + 0.5) /
                         ((auVar8._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)Nx) - 4503599627370496.0)),
                         ((auVar9._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0) + 0.5) /
                         ((auVar12._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)Ny) - 4503599627370496.0)),delta,rho);
      pdVar1 = scp::Tensor<double>::operator[]((Tensor<double> *)&i,j);
      *pdVar1 = dVar4;
      j = j + 1;
    }
  }
  dtx = 0.0;
  local_158 = 0;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&saveThread,name,auto_format);
  simanim::createAnimation((path *)&saveThread,Nx,Ny);
  std::filesystem::__cxx11::path::~path((path *)&saveThread);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_1b0,name,auto_format);
  local_1b8 = std::ref<scp::Matrix<double>>((Matrix<double> *)&i);
  std::thread::
  thread<void(&)(std::filesystem::__cxx11::path_const&,double,scp::Matrix<double>const&),std::filesystem::__cxx11::path,double&,std::reference_wrapper<scp::Matrix<double>>,void>
            (&local_188,simanim::saveAnimationFrame,&local_1b0,&dtx,&local_1b8);
  std::filesystem::__cxx11::path::~path(&local_1b0);
  for (; dtx < tSimu; dtx = dVar4 + dtx) {
    local_158 = local_158 + 1;
    poVar2 = std::operator<<((ostream *)&std::cout,"> Iteration ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_158);
    poVar2 = std::operator<<(poVar2," a t=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dtx);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    anon_unknown.dwarf_17a80::velocityFromCurl
              ((Matrix<double> *)&i,(Matrix<double> *)local_98,(Matrix<double> *)local_d0,Lx,Ly);
    pdVar1 = scp::Tensor<double>::begin((Tensor<double> *)local_98);
    pdVar3 = scp::Tensor<double>::end((Tensor<double> *)local_98);
    std::
    max_element<double*,simuFluide2D(std::__cxx11::string_const&,unsigned_long,unsigned_long,double,double,double,double,double,double)::__0>
              (pdVar1,pdVar3);
    std::abs((int)pdVar1);
    dty = dx_00 / extraout_XMM0_Qa;
    pdVar1 = scp::Tensor<double>::begin((Tensor<double> *)local_d0);
    pdVar3 = scp::Tensor<double>::end((Tensor<double> *)local_d0);
    std::
    max_element<double*,simuFluide2D(std::__cxx11::string_const&,unsigned_long,unsigned_long,double,double,double,double,double,double)::__1>
              (pdVar1,pdVar3);
    std::abs((int)pdVar1);
    dt = dy_00 / extraout_XMM0_Qa_00;
    pdVar1 = std::min<double>(&dty,&dt);
    dVar4 = *pdVar1;
    std::thread::join();
    dVar4 = anon_unknown.dwarf_17a80::curl2D
                      ((Matrix<double> *)&i,(Matrix<double> *)local_98,(Matrix<double> *)local_d0,
                       (double)Ux.super_Tensor<double>._40_8_,dx_00,dy_00,dVar4);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_1f0,name,auto_format);
    local_1f8 = std::ref<scp::Matrix<double>>((Matrix<double> *)&i);
    std::thread::
    thread<void(&)(std::filesystem::__cxx11::path_const&,double,scp::Matrix<double>const&),std::filesystem::__cxx11::path,double&,std::reference_wrapper<scp::Matrix<double>>,void>
              (local_1c8,simanim::saveAnimationFrame,&local_1f0,&dtx,&local_1f8);
    std::thread::operator=(&local_188,local_1c8);
    std::thread::~thread(local_1c8);
    std::filesystem::__cxx11::path::~path(&local_1f0);
  }
  std::thread::join();
  std::thread::~thread(&local_188);
  scp::Matrix<double>::~Matrix((Matrix<double> *)&i);
  scp::Matrix<double>::~Matrix((Matrix<double> *)local_d0);
  scp::Matrix<double>::~Matrix((Matrix<double> *)local_98);
  return;
}

Assistant:

void simuFluide2D(const std::string& name, uint64_t Nx, uint64_t Ny, double tSimu, double nu, double rho, double delta, double Lx, double Ly)
{
	double dx = Lx / Nx;
	double dy = Ly / Ny;
	double kappa = nu / rho;
	scp::Matrix<double> Ux(Ny, Nx, 0.0);
	scp::Matrix<double> Uy(Ny, Nx, 0.0);
	scp::Matrix<double> W(Ny, Nx);

	for (uint64_t i = 0, n = 0; i < Ny; ++i)
	{
		for (uint64_t j = 0; j < Nx; ++j, ++n)
		{
			W[n] = wInit((j + 0.5) / Nx, (i + 0.5) / Ny, delta, rho);
		}
	}

	double t(0), dtx, dty, dt;
	uint64_t iterations = 0;

	simanim::createAnimation(name, Nx, Ny);
	std::thread saveThread(simanim::saveAnimationFrame, fs::path(name), t, std::ref(W));
	while (t < tSimu)
	{
		iterations++;
		std::cout << "> Iteration " << iterations << " a t=" << t << std::endl;

		velocityFromCurl(W, Ux, Uy, Lx, Ly);

		dtx = dx / std::abs(*std::max_element(Ux.begin(), Ux.end(), [](double x, double y) { return std::abs(x) < std::abs(y); }));
		dty = dy / std::abs(*std::max_element(Uy.begin(), Uy.end(), [](double x, double y) { return std::abs(x) < std::abs(y); }));
		dt = std::min(dtx, dty);

		saveThread.join();
		dt = curl2D(W, Ux, Uy, kappa, dx, dy, dt);
		saveThread = std::thread(simanim::saveAnimationFrame, fs::path(name), t, std::ref(W));

		t += dt;
	}

	saveThread.join();
}